

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void CheckRamLimitExceeded(void)

{
  char *pcVar1;
  bool bVar2;
  char buf [64];
  char acStack_58 [72];
  
  if (Options::IsLongPtr != '\0') {
    return;
  }
  if (CurAddress < 0x10000) {
    CheckRamLimitExceeded()::notWarnedCurAdr = '\0';
    bVar2 = PseudoORG != DISP_NONE;
  }
  else {
    if ((pass == 3) && (CheckRamLimitExceeded()::notWarnedCurAdr == '\0')) {
      pcVar1 = "DISP";
      if (PseudoORG == DISP_NONE) {
        pcVar1 = "ORG";
      }
      snprintf(acStack_58,0x40,"RAM limit exceeded 0x%X by %s",(ulong)(uint)CurAddress,pcVar1);
      Warning(acStack_58,(char *)0x0,W_PASS3);
      CheckRamLimitExceeded()::notWarnedCurAdr = '\x01';
    }
    if (PseudoORG == DISP_NONE) {
      CheckRamLimitExceeded()::notWarnedDisp = 0;
      return;
    }
    CurAddress = CurAddress & 0xffff;
    bVar2 = true;
  }
  if (!(bool)(0xffff < adrdisp & bVar2)) {
    CheckRamLimitExceeded()::notWarnedDisp = 0;
    return;
  }
  if (pass == 3) {
    if (CheckRamLimitExceeded()::notWarnedDisp == '\0') {
      snprintf(acStack_58,0x40,"RAM limit exceeded 0x%X by ORG");
      Warning(acStack_58,(char *)0x0,W_PASS3);
      CheckRamLimitExceeded()::notWarnedDisp = 1;
      return;
    }
    return;
  }
  return;
}

Assistant:

void CheckRamLimitExceeded() {
	if (Options::IsLongPtr) return;		// in "longptr" mode with no device keep the address as is
	static bool notWarnedCurAdr = true;
	static bool notWarnedDisp = true;
	char buf[64];
	if (CurAddress >= 0x10000) {
		if (LASTPASS == pass && notWarnedCurAdr) {
			SPRINTF2(buf, 64, "RAM limit exceeded 0x%X by %s",
					 (unsigned int)CurAddress, DISP_NONE != PseudoORG ? "DISP":"ORG");
			Warning(buf);
			notWarnedCurAdr = false;
		}
		if (DISP_NONE != PseudoORG) CurAddress &= 0xFFFF;	// fake DISP address gets auto-wrapped FFFF->0
	} else notWarnedCurAdr = true;
	if (DISP_NONE != PseudoORG && adrdisp >= 0x10000) {
		if (LASTPASS == pass && notWarnedDisp) {
			SPRINTF1(buf, 64, "RAM limit exceeded 0x%X by ORG", (unsigned int)adrdisp);
			Warning(buf);
			notWarnedDisp = false;
		}
	} else notWarnedDisp = true;
}